

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O3

sftp_packet * sftp_recv_prepare(uint length)

{
  ulong factor1;
  sftp_packet *psVar1;
  char *pcVar2;
  
  factor1 = (ulong)length;
  psVar1 = (sftp_packet *)safemalloc(1,0x68,0);
  psVar1->savedpos = 0;
  psVar1->maxlen = factor1;
  psVar1->length = factor1;
  pcVar2 = (char *)safemalloc(factor1,1,0);
  psVar1->data = pcVar2;
  return psVar1;
}

Assistant:

struct sftp_packet *sftp_recv_prepare(unsigned length)
{
    struct sftp_packet *pkt;

    pkt = snew(struct sftp_packet);
    pkt->savedpos = 0;
    pkt->length = pkt->maxlen = length;
    pkt->data = snewn(pkt->length, char);

    return pkt;
}